

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evenOdd.cpp
# Opt level: O2

int calculateEvenOddDifference(int *array,int size)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar3 = 0;
  uVar5 = (ulong)(uint)size;
  if (size < 1) {
    uVar5 = uVar3;
  }
  iVar2 = 0;
  iVar4 = 0;
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = array[uVar3];
    uVar6 = 0;
    if ((uVar1 & 1) == 0) {
      uVar6 = uVar1;
    }
    iVar2 = iVar2 + uVar6;
    iVar4 = iVar4 + (-(uVar1 & 1) & uVar1);
  }
  return iVar2 - iVar4;
}

Assistant:

int calculateEvenOddDifference(int array[], int size)
{
    int evenTotal = 0;
    int oddTotal = 0;

    for(int x = 0; x < size; x++)
    {

        // if value is even...
        if((array[x] % 2) == 0)
        {
            evenTotal += array[x];
        }
        else
        {
            oddTotal += array[x];
        }
    }
    //easy way to calculate what is asked for
    return evenTotal - oddTotal;
}